

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chpst.c
# Opt level: O1

void euidgid(char *user,uint ext)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  char *x2;
  char bufnum [40];
  uidgid ugid;
  char local_138 [52];
  uidgid local_104;
  
  if (ext == 0) {
    uVar1 = uidgid_get(&local_104,user);
    if (uVar1 != 0) goto LAB_00103722;
    piVar3 = __errno_location();
    if (*piVar3 != 0) {
      strerr_die(0x6f,"chpst: fatal: ","unable to get password file entry",": ",(char *)0x0,
                 (char *)0x0,(char *)0x0,&strerr_sys);
    }
    x2 = "unknown account";
  }
  else {
    uVar1 = uidgids_get(&local_104,user);
    if (uVar1 != 0) goto LAB_00103722;
    if (*user == ':') {
      strerr_die(0x6f,"chpst: fatal: ","invalid uid/gids",": ",user + 1,(char *)0x0,(char *)0x0,
                 (strerr *)0x0);
    }
    piVar3 = __errno_location();
    if (*piVar3 != 0) {
      strerr_die(0x6f,"chpst: fatal: ","unable to get password/group file entry",": ",(char *)0x0,
                 (char *)0x0,(char *)0x0,&strerr_sys);
    }
    x2 = "unknown user/group";
  }
  strerr_die(0x6f,"chpst: fatal: ",x2,": ",user,(char *)0x0,(char *)0x0,(strerr *)0x0);
LAB_00103722:
  uVar1 = fmt_ulong(local_138,(ulong)local_104.gid[0]);
  local_138[uVar1] = '\0';
  iVar2 = pathexec_env("GID",local_138);
  if (iVar2 == 0) {
    strerr_die(0x6f,"chpst: fatal: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0,(strerr *)0x0);
  }
  uVar1 = fmt_ulong(local_138,(ulong)local_104.uid);
  local_138[uVar1] = '\0';
  iVar2 = pathexec_env("UID",local_138);
  if (iVar2 == 0) {
    strerr_die(0x6f,"chpst: fatal: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0,(strerr *)0x0);
  }
  return;
}

Assistant:

void euidgid(char *user, unsigned int ext) {
  struct uidgid ugid;
  char bufnum[FMT_ULONG];

  if (ext) {
    if (! uidgids_get(&ugid, user)) {
      if (*user == ':') fatalx("invalid uid/gids", user +1);
      if (errno) fatal("unable to get password/group file entry");
      fatalx("unknown user/group", user);
    }
  }
  else
    if (! uidgid_get(&ugid, user)) {
      if (errno) fatal("unable to get password file entry");
      fatalx("unknown account", user);
    }
  bufnum[fmt_ulong(bufnum, *ugid.gid)] =0;
  if (! pathexec_env("GID", bufnum)) die_nomem();
  bufnum[fmt_ulong(bufnum, ugid.uid)] =0;
  if (! pathexec_env("UID", bufnum)) die_nomem();
}